

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O3

int __thiscall TreeItem::row(TreeItem *this)

{
  int iVar1;
  int iVar2;
  TreeItem *pTVar3;
  
  pTVar3 = this->parentItem;
  if ((pTVar3 != (TreeItem *)0x0) &&
     (iVar1 = (int)(pTVar3->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
                   _M_impl._M_node._M_size, 0 < iVar1)) {
    iVar2 = 0;
    do {
      pTVar3 = (TreeItem *)
               (pTVar3->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if ((TreeItem *)
          (pTVar3->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
          _M_node._M_size == this) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  return 0;
}

Assistant:

int TreeItem::row() const
{
    if (parentItem) {
        std::list<TreeItem*>::const_iterator iter = parentItem->childItems.begin();
        for (int i = 0; i < (int)parentItem->childItems.size(); ++i, ++iter) {
            if (const_cast<TreeItem*>(this) == *iter)
                return i;
        }
    }
    return 0;
}